

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O3

void __thiscall
chrono::ChParticleCloud::IntStateGetIncrement
          (ChParticleCloud *this,uint off_x,ChState *x_new,ChState *x,uint off_v,ChStateDelta *Dv)

{
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  ChStateDelta *pCVar6;
  uint uVar7;
  ulong uVar8;
  char *__function;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  double dVar27;
  undefined1 auVar28 [16];
  double dVar29;
  undefined1 auVar30 [16];
  ChVector<double> angle_axis;
  ChQuaternion<double> q_new;
  ChQuaternion<double> q_old;
  double *local_d8;
  double local_d0;
  double local_c8;
  ChState *local_c0;
  ulong local_b8;
  ulong local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  ChStateDelta *local_80;
  ChParticleCloud *local_78;
  ChQuaternion<double> local_70;
  ChQuaternion<double> local_50;
  
  if ((this->particles).
      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->particles).
      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar12 = off_v + 3;
    uVar10 = 1;
    local_80 = Dv;
    local_78 = this;
    do {
      pCVar6 = local_80;
      uVar8 = (ulong)off_x;
      uVar9 = (x_new->super_ChVectorDynamic<double>).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      if (((long)uVar9 <= (long)uVar8) ||
         (uVar1 = (x->super_ChVectorDynamic<double>).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
         (long)uVar1 <= (long)uVar8)) {
LAB_00531ac2:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                     );
      }
      uVar2 = (local_80->super_ChVectorDynamic<double>).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      uVar13 = (ulong)uVar12;
      if ((long)uVar2 <= (long)(ulong)(uVar12 - 3)) {
LAB_00531ae1:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      pdVar3 = (local_80->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      pdVar4 = (x_new->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      pdVar5 = (x->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      pdVar3[uVar12 - 3] = pdVar4[uVar8] - pdVar5[uVar8];
      uVar8 = (ulong)(off_x + 1);
      if ((uVar9 <= uVar8) || (uVar1 <= uVar8)) goto LAB_00531ac2;
      if (uVar2 <= uVar12 - 2) goto LAB_00531ae1;
      uVar11 = (ulong)(off_x + 2);
      pdVar3[uVar12 - 2] = pdVar4[uVar8] - pdVar5[uVar8];
      if ((uVar9 <= uVar11) || (uVar1 <= uVar11)) goto LAB_00531ac2;
      if (uVar2 <= uVar12 - 1) goto LAB_00531ae1;
      uVar9 = (ulong)(off_x + 3);
      local_d8 = pdVar5 + uVar9;
      pdVar3[uVar12 - 1] = pdVar4[uVar11] - pdVar5[uVar11];
      local_d0 = 1.97626258336499e-323;
      local_c0 = x;
      local_a8 = uVar1;
      if ((long)(uVar1 - 4) < (long)uVar9) {
LAB_00531b00:
        local_d0 = 1.97626258336499e-323;
        __function = 
        "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
        ;
        local_b8 = uVar9;
LAB_00531b2c:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
      }
      local_b8 = uVar9;
      ChQuaternion<double>::
      ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&local_50,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_d8,(type *)0x0);
      local_d8 = (x_new->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 uVar9;
      local_a8 = (x_new->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_d0 = 1.97626258336499e-323;
      local_c0 = x_new;
      if ((long)(local_a8 - 4) < (long)uVar9) goto LAB_00531b00;
      local_b8 = uVar9;
      ChQuaternion<double>::
      ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&local_70,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_d8,(type *)0x0);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_50.m_data[2];
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_70.m_data[0];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_50.m_data[1];
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_50.m_data[0];
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_70.m_data[2];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_70.m_data[1];
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_50.m_data[3];
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_70.m_data[3];
      dVar25 = 2.0;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_70.m_data[0] * local_50.m_data[2];
      auVar24 = vfmsub231sd_fma(auVar28,auVar17,auVar20);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_70.m_data[0] * local_50.m_data[1];
      auVar26 = vfmsub231sd_fma(auVar26,auVar17,auVar23);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_70.m_data[0] * local_50.m_data[3];
      auVar28 = vfmsub231sd_fma(auVar30,auVar17,auVar16);
      auVar30 = vfnmadd231sd_fma(auVar24,auVar15,auVar23);
      auVar24 = vfmadd231sd_fma(auVar26,auVar15,auVar20);
      auVar26 = vfmadd231sd_fma(auVar28,auVar18,auVar23);
      auVar28 = vfmadd231sd_fma(auVar30,auVar21,auVar16);
      dVar27 = auVar28._0_8_;
      auVar28 = vfnmadd231sd_fma(auVar24,auVar18,auVar16);
      auVar26 = vfnmadd231sd_fma(auVar26,auVar21,auVar20);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar27 * dVar27;
      auVar24 = vfmadd231sd_fma(auVar24,auVar28,auVar28);
      auVar24 = vfmadd231sd_fma(auVar24,auVar26,auVar26);
      dVar14 = auVar28._0_8_;
      dVar29 = auVar26._0_8_;
      if (1e-30 < auVar24._0_8_) {
        auVar22._8_8_ = 0;
        auVar22._0_8_ = local_50.m_data[1] * local_70.m_data[1];
        auVar30 = vfmadd213sd_fma(auVar19,auVar17,auVar22);
        auVar30 = vfmadd213sd_fma(auVar20,auVar18,auVar30);
        auVar30 = vfmadd213sd_fma(auVar16,auVar15,auVar30);
        auVar24 = vsqrtsd_avx(auVar24,auVar24);
        local_a0 = auVar24._0_8_;
        local_98 = auVar26._0_8_;
        local_90 = dVar27;
        local_88 = auVar28._0_8_;
        dVar14 = atan2(local_a0,auVar30._0_8_);
        dVar25 = (dVar14 + dVar14) / local_a0;
        dVar14 = local_88;
        dVar29 = local_98;
        dVar27 = local_90;
      }
      local_d8 = (double *)(dVar14 * dVar25);
      local_c8 = dVar29 * dVar25;
      local_d0 = dVar27 * dVar25;
      if ((pCVar6->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3 <
          (long)uVar13) {
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_00531b2c;
      }
      pdVar4 = (pCVar6->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar9 = 3;
      pdVar3 = pdVar4 + uVar13;
      if (((ulong)pdVar3 & 7) == 0) {
        uVar7 = -((uint)((ulong)pdVar3 >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar7 < 3) {
          uVar9 = (ulong)uVar7;
        }
        if (uVar7 != 0) goto LAB_00531a47;
      }
      else {
LAB_00531a47:
        memcpy(pdVar3,&local_d8,(ulong)(uint)((int)uVar9 * 8));
      }
      if ((uint)uVar9 < 3) {
        uVar8 = (ulong)((uint)uVar9 * 8);
        memcpy(pdVar4 + uVar9 + uVar13,(void *)((long)&local_d8 + uVar8),0x18 - uVar8);
      }
      uVar9 = (ulong)uVar10;
      uVar12 = uVar12 + 6;
      off_x = off_x + 7;
      uVar10 = uVar10 + 1;
    } while (uVar9 < (ulong)((long)(local_78->particles).
                                   super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(local_78->particles).
                                   super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void ChParticleCloud::IntStateGetIncrement(const unsigned int off_x,  // offset in x state vector
                                          const ChState& x_new,            // state vector, position part, incremented result
                                          const ChState& x,          // state vector, initial position part
                                          const unsigned int off_v,  // offset in v state vector
                                          ChStateDelta& Dv     // state vector, increment
                                          ) {
    for (unsigned int j = 0; j < particles.size(); j++) {
        // POSITION:
        Dv(off_v + 6 * j) = x_new(off_x + 7 * j) - x(off_x + 7 * j);
        Dv(off_v + 6 * j + 1) = x_new(off_x + 7 * j + 1) - x(off_x + 7 * j + 1);
        Dv(off_v + 6 * j + 2) = x_new(off_x + 7 * j + 2) - x(off_x + 7 * j + 2);

        // ROTATION (quaternions): Dq_loc = q_old^-1 * q_new,
        //  because   q_new = Dq_abs * q_old   = q_old * Dq_loc
        ChQuaternion<> q_old(x.segment(off_x + 7 * j + 3, 4));
        ChQuaternion<> q_new(x_new.segment(off_x + 7 * j + 3, 4));
        ChQuaternion<> rel_q = q_old.GetConjugate() % q_new;
        Dv.segment(off_v + 6 *j + 3, 3) = rel_q.Q_to_Rotv().eigen();
    }
}